

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

int png_image_write_to_memory
              (png_imagep image,void *memory,png_alloc_size_t *memory_bytes,int convert_to_8bit,
              void *buffer,png_int_32 row_stride,void *colormap)

{
  int iVar1;
  int local_9c;
  png_imagep paStack_98;
  int result;
  png_image_write_control display;
  png_int_32 row_stride_local;
  void *buffer_local;
  int convert_to_8bit_local;
  png_alloc_size_t *memory_bytes_local;
  void *memory_local;
  png_imagep image_local;
  
  display.output_bytes._4_4_ = row_stride;
  if ((image == (png_imagep)0x0) || (image->version != 1)) {
    if (image == (png_imagep)0x0) {
      image_local._4_4_ = 0;
    }
    else {
      image_local._4_4_ =
           png_image_error(image,"png_image_write_to_memory: incorrect PNG_IMAGE_VERSION");
    }
  }
  else if ((memory_bytes == (png_alloc_size_t *)0x0) || (buffer == (void *)0x0)) {
    image_local._4_4_ = png_image_error(image,"png_image_write_to_memory: invalid argument");
  }
  else {
    if (memory == (void *)0x0) {
      *memory_bytes = 0;
    }
    iVar1 = png_image_write_init(image);
    if (iVar1 == 0) {
      image_local._4_4_ = 0;
    }
    else {
      memset(&stack0xffffffffffffff68,0,0x58);
      display.buffer._0_4_ = display.output_bytes._4_4_;
      display._16_8_ = colormap;
      display.memory = (png_bytep)*memory_bytes;
      display.memory_bytes = 0;
      paStack_98 = image;
      display.image = (png_imagep)buffer;
      display.colormap._0_4_ = convert_to_8bit;
      display.local_row = memory;
      local_9c = png_safe_execute(image,png_image_write_memory,&stack0xffffffffffffff68);
      png_image_free(image);
      if (local_9c != 0) {
        if ((memory != (void *)0x0) && (*memory_bytes < display.memory_bytes)) {
          local_9c = 0;
        }
        *memory_bytes = display.memory_bytes;
      }
      image_local._4_4_ = local_9c;
    }
  }
  return image_local._4_4_;
}

Assistant:

int PNGAPI
png_image_write_to_memory(png_imagep image, void *memory,
    png_alloc_size_t * PNG_RESTRICT memory_bytes, int convert_to_8bit,
    const void *buffer, png_int_32 row_stride, const void *colormap)
{
   /* Write the image to the given buffer, or count the bytes if it is NULL */
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (memory_bytes != NULL && buffer != NULL)
      {
         /* This is to give the caller an easier error detection in the NULL
          * case and guard against uninitialized variable problems:
          */
         if (memory == NULL)
            *memory_bytes = 0;

         if (png_image_write_init(image) != 0)
         {
            png_image_write_control display;
            int result;

            memset(&display, 0, (sizeof display));
            display.image = image;
            display.buffer = buffer;
            display.row_stride = row_stride;
            display.colormap = colormap;
            display.convert_to_8bit = convert_to_8bit;
            display.memory = png_voidcast(png_bytep, memory);
            display.memory_bytes = *memory_bytes;
            display.output_bytes = 0;

            result = png_safe_execute(image, png_image_write_memory, &display);
            png_image_free(image);

            /* write_memory returns true even if we ran out of buffer. */
            if (result)
            {
               /* On out-of-buffer this function returns '0' but still updates
                * memory_bytes:
                */
               if (memory != NULL && display.output_bytes > *memory_bytes)
                  result = 0;

               *memory_bytes = display.output_bytes;
            }

            return result;
         }

         else
            return 0;
      }

      else
         return png_image_error(image,
             "png_image_write_to_memory: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_write_to_memory: incorrect PNG_IMAGE_VERSION");

   else
      return 0;
}